

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_cox_putcompparms
              (jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out,int prtflag,
              jpc_coxcp_t *compparms)

{
  int iVar1;
  int local_3c;
  int i;
  jpc_coxcp_t *compparms_local;
  int prtflag_local;
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  if (0x20 < compparms->numdlvls) {
    __assert_fail("compparms->numdlvls <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_cs.c"
                  ,0x343,
                  "int jpc_cox_putcompparms(jpc_ms_t *, jpc_cstate_t *, jas_stream_t *, int, jpc_coxcp_t *)"
                 );
  }
  iVar1 = jpc_putuint8(out,compparms->numdlvls);
  if ((((iVar1 == 0) && (iVar1 = jpc_putuint8(out,compparms->cblkwidthval), iVar1 == 0)) &&
      (iVar1 = jpc_putuint8(out,compparms->cblkheightval), iVar1 == 0)) &&
     ((iVar1 = jpc_putuint8(out,compparms->cblksty), iVar1 == 0 &&
      (iVar1 = jpc_putuint8(out,compparms->qmfbid), iVar1 == 0)))) {
    if (prtflag != 0) {
      for (local_3c = 0; local_3c < compparms->numrlvls; local_3c = local_3c + 1) {
        iVar1 = jpc_putuint8(out,compparms->rlvls[local_3c].parheightval << 4 |
                                 compparms->rlvls[local_3c].parwidthval & 0xf);
        if (iVar1 != 0) {
          return -1;
        }
      }
    }
    ms_local._4_4_ = 0;
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_cox_putcompparms(jpc_ms_t *ms, jpc_cstate_t *cstate,
  jas_stream_t *out, int prtflag, jpc_coxcp_t *compparms)
{
	int i;
	assert(compparms->numdlvls <= 32);

	/* Eliminate compiler warning about unused variables. */
	(void)ms;
	(void)cstate;

	if (jpc_putuint8(out, compparms->numdlvls) ||
	  jpc_putuint8(out, compparms->cblkwidthval) ||
	  jpc_putuint8(out, compparms->cblkheightval) ||
	  jpc_putuint8(out, compparms->cblksty) ||
	  jpc_putuint8(out, compparms->qmfbid)) {
		return -1;
	}
	if (prtflag) {
		for (i = 0; i < compparms->numrlvls; ++i) {
			if (jpc_putuint8(out,
			  ((compparms->rlvls[i].parheightval & 0xf) << 4) |
			  (compparms->rlvls[i].parwidthval & 0xf))) {
				return -1;
			}
		}
	}
	return 0;
}